

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O2

void m_respond(monst *mtmp)

{
  attack *mattk;
  attack *paVar1;
  uint uVar2;
  char *pcVar3;
  permonst *ppVar4;
  attack *paVar5;
  long lVar6;
  bool bVar7;
  
  ppVar4 = mtmp->data;
  if (ppVar4->msound == '\x0f') {
    if (flags.soundok != '\0') {
      pcVar3 = Monnam(mtmp);
      pline("%s shrieks.",pcVar3);
      stop_occupation();
    }
    uVar2 = mt_random();
    if (uVar2 % 10 == 0) {
      uVar2 = mt_random();
      if (uVar2 % 0xd == 0) {
        ppVar4 = mons + 0x77;
      }
      else {
        ppVar4 = (permonst *)0x0;
      }
      makemon(ppVar4,level,0,0,0);
    }
    aggravate();
    ppVar4 = mtmp->data;
  }
  if (ppVar4 == mons + 0x127) {
    lVar6 = 6;
    paVar5 = (attack *)&mons[0x127].mr;
    while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
      mattk = paVar5 + 1;
      paVar1 = paVar5 + 1;
      paVar5 = mattk;
      if (paVar1->aatyp == '\x0f') {
        gazemu(mtmp,mattk);
        return;
      }
    }
  }
  return;
}

Assistant:

void m_respond(struct monst *mtmp)
{
    if (mtmp->data->msound == MS_SHRIEK) {
	if (flags.soundok) {
	    pline("%s shrieks.", Monnam(mtmp));
	    stop_occupation();
	}
	if (!rn2(10)) {
	    if (!rn2(13))
		makemon(&mons[PM_PURPLE_WORM], level, 0, 0, NO_MM_FLAGS);
	    else
		makemon(NULL, level, 0, 0, NO_MM_FLAGS);

	}
	aggravate();
    }
    if (mtmp->data == &mons[PM_MEDUSA]) {
	int i;
	for (i = 0; i < NATTK; i++)
	     if (mtmp->data->mattk[i].aatyp == AT_GAZE) {
		 gazemu(mtmp, &mtmp->data->mattk[i]);
		 break;
	     }
    }
}